

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O2

void absl::lts_20250127::raw_log_internal::AsyncSignalSafeWriteError(char *s,size_t len)

{
  int iVar1;
  int *piVar2;
  
  if (len != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    syscall(1,2,s,len);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void AsyncSignalSafeWriteError(const char* s, size_t len) {
  if (!len) return;
  absl::base_internal::ErrnoSaver errno_saver;
#if defined(__EMSCRIPTEN__)
  // In WebAssembly, bypass filesystem emulation via fwrite.
  if (s[len - 1] == '\n') {
    // Skip a trailing newline character as emscripten_errn adds one itself.
    len--;
  }
  // emscripten_errn was introduced in 3.1.41 but broken in standalone mode
  // until 3.1.43.
#if ABSL_INTERNAL_EMSCRIPTEN_VERSION >= 3001043
  emscripten_errn(s, len);
#else
  char buf[kLogBufSize];
  if (len >= kLogBufSize) {
    len = kLogBufSize - 1;
    constexpr size_t trunc_len = sizeof(kTruncated) - 2;
    memcpy(buf + len - trunc_len, kTruncated, trunc_len);
    buf[len] = '\0';
    len -= trunc_len;
  } else {
    buf[len] = '\0';
  }
  memcpy(buf, s, len);
  _emscripten_err(buf);
#endif
#elif defined(ABSL_HAVE_SYSCALL_WRITE)
  // We prefer calling write via `syscall` to minimize the risk of libc doing
  // something "helpful".
  syscall(SYS_write, STDERR_FILENO, s, len);
#elif defined(ABSL_HAVE_POSIX_WRITE)
  write(STDERR_FILENO, s, len);
#elif defined(ABSL_HAVE_RAW_IO)
  _write(/* stderr */ 2, s, static_cast<unsigned>(len));
#else
  // stderr logging unsupported on this platform
  (void)s;
  (void)len;
#endif
}